

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_encoder_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::LabelEncoderTest_unicode_Test::TestBody
          (LabelEncoderTest_unicode_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_b8;
  Message local_b0 [3];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  string local_58;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  char unicodeText [19];
  LabelEncoderTest_unicode_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0xbccebfce81cfa0ce;
  ::std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[19],_true>
            (&local_98,(char (*) [5])0x171e61,(char (*) [19])&gtest_ar.message_);
  LabelEncoderTest::Encode(&local_58,&this->super_LabelEncoderTest,&local_98);
  testing::internal::EqHelper::
  Compare<char[38],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_38,"\"/name@base64/zqDPgc6_zrzOt864zrXPjc-C\"",
             "Encode(Label{\"name\", unicodeText})",
             (char (*) [38])"/name@base64/zqDPgc6_zrzOt864zrXPjc-C",&local_58);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_b0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/push/tests/internal/label_encoder_test.cc"
               ,0x27,message);
    testing::internal::AssertHelper::operator=(&local_b8,local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::Message::~Message(local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

TEST_F(LabelEncoderTest, unicode) {
  const char unicodeText[] =
      "\xce\xa0\xcf\x81\xce\xbf\xce\xbc\xce\xb7\xce\xb8\xce\xb5\xcf\x8d\xcf"
      "\x82";  // Προμηθεύς
  EXPECT_EQ("/name@base64/zqDPgc6_zrzOt864zrXPjc-C",
            Encode(Label{"name", unicodeText}));
}